

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v8::detail::utf8_decode(char *s,uint32_t *c,int *e)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(byte)*s >> 3] +
          (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                        [(byte)*s >> 3] == 0);
  uVar2 = ((int)*s & *(uint *)(&DAT_001c5780 + lVar1 * 4)) << 0x12;
  *c = uVar2;
  uVar2 = ((byte)s[1] & 0x3f) << 0xc | uVar2;
  *c = uVar2;
  uVar2 = ((byte)s[2] & 0x3f) << 6 | uVar2;
  *c = uVar2;
  uVar2 = ((byte)s[3] & 0x3f | uVar2) >> ((&DAT_001c57c0)[lVar1 * 4] & 0x1f);
  *c = uVar2;
  uVar2 = (uint)(uVar2 < *(uint *)(&DAT_001c57a0 + lVar1 * 4)) << 6;
  *e = uVar2;
  uVar2 = (uint)((*c & 0xfffff800) == 0xd800) << 7 | uVar2;
  *e = uVar2;
  uVar2 = (uint)(0x10ffff < *c) << 8 | uVar2;
  *e = uVar2;
  uVar2 = (byte)s[1] >> 2 & 0x30 | uVar2;
  *e = uVar2;
  uVar2 = (byte)s[2] >> 4 & 0xc | uVar2;
  *e = uVar2;
  *e = (((byte)s[3] >> 6 | uVar2) ^ 0x2a) >> ((&DAT_001c57e0)[lVar1 * 4] & 0x1f);
  return s + lVar1;
}

Assistant:

FMT_CONSTEXPR inline auto utf8_decode(const char* s, uint32_t* c, int* e)
    -> const char* {
  constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
  constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
  constexpr const int shiftc[] = {0, 18, 12, 6, 0};
  constexpr const int shifte[] = {0, 6, 4, 2, 0};

  int len = code_point_length(s);
  const char* next = s + len;

  // Assume a four-byte character and load four bytes. Unused bits are
  // shifted out.
  *c = uint32_t(s[0] & masks[len]) << 18;
  *c |= uint32_t(s[1] & 0x3f) << 12;
  *c |= uint32_t(s[2] & 0x3f) << 6;
  *c |= uint32_t(s[3] & 0x3f) << 0;
  *c >>= shiftc[len];

  // Accumulate the various error conditions.
  using uchar = unsigned char;
  *e = (*c < mins[len]) << 6;       // non-canonical encoding
  *e |= ((*c >> 11) == 0x1b) << 7;  // surrogate half?
  *e |= (*c > 0x10FFFF) << 8;       // out of range?
  *e |= (uchar(s[1]) & 0xc0) >> 2;
  *e |= (uchar(s[2]) & 0xc0) >> 4;
  *e |= uchar(s[3]) >> 6;
  *e ^= 0x2a;  // top two bits of each tail byte correct?
  *e >>= shifte[len];

  return next;
}